

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# API.cpp
# Opt level: O1

void queries::API::TriplePatern
               (vector<diplo::TripleIDs,_std::allocator<diplo::TripleIDs>_> *constrains,
               vector<diplo::TripleIDs,_std::allocator<diplo::TripleIDs>_> *projections,
               vector<std::vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>
               *resultsmaster,
               vector<std::vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>
               *provmaster)

{
  pointer pTVar1;
  _Hash_node_base *p_Var2;
  KEY_ID id;
  bool bVar3;
  __node_base _Var4;
  pointer ppVar5;
  TYPE_ID TVar6;
  TYPE_ID s;
  _Rb_tree<std::pair<unsigned_long_const,Molecule>*,std::pair<unsigned_long_const,Molecule>*,std::_Identity<std::pair<unsigned_long_const,Molecule>*>,std::less<std::pair<unsigned_long_const,Molecule>*>,std::allocator<std::pair<unsigned_long_const,Molecule>*>>
  *this;
  __node_base_ptr p_Var7;
  _Rb_tree_node_base *p_Var8;
  _Self __tmp;
  ulong uVar9;
  undefined1 local_100 [8];
  set<std::pair<const_unsigned_long,_Molecule>_*,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
  molecules;
  undefined1 auStack_b8 [8];
  vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
  results;
  undefined1 auStack_98 [8];
  vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
  prov;
  pair<const_unsigned_long,_Molecule> *local_78;
  pair<const_unsigned_long,_Molecule> *m;
  __node_base local_68;
  size_type sStack_60;
  float local_58;
  size_t local_50;
  __node_base_ptr p_Stack_48;
  pointer local_40;
  uint local_34;
  
  molecules._M_t._M_impl._0_4_ = 0;
  molecules._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  molecules._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  molecules._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&molecules;
  molecules._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&molecules;
  molecules._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  pTVar1 = (constrains->super__Vector_base<diplo::TripleIDs,_std::allocator<diplo::TripleIDs>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((constrains->super__Vector_base<diplo::TripleIDs,_std::allocator<diplo::TripleIDs>_>)._M_impl.
      super__Vector_impl_data._M_finish == pTVar1) {
    local_78 = Molecules::GetPair((Molecules *)diplo::M,
                                  ((projections->
                                   super__Vector_base<diplo::TripleIDs,_std::allocator<diplo::TripleIDs>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->subject);
    if (local_78 != (pair<const_unsigned_long,_Molecule> *)0x0) {
      this = (_Rb_tree<std::pair<unsigned_long_const,Molecule>*,std::pair<unsigned_long_const,Molecule>*,std::_Identity<std::pair<unsigned_long_const,Molecule>*>,std::less<std::pair<unsigned_long_const,Molecule>*>,std::allocator<std::pair<unsigned_long_const,Molecule>*>>
              *)local_100;
      std::
      _Rb_tree<std::pair<unsigned_long_const,Molecule>*,std::pair<unsigned_long_const,Molecule>*,std::_Identity<std::pair<unsigned_long_const,Molecule>*>,std::less<std::pair<unsigned_long_const,Molecule>*>,std::allocator<std::pair<unsigned_long_const,Molecule>*>>
      ::_M_insert_unique<std::pair<unsigned_long_const,Molecule>*const&>
                (this,&stack0xffffffffffffff88);
      goto LAB_0011ad1c;
    }
  }
  else if (pTVar1->subject == 0) {
    if (pTVar1->object != 0xffffffffffffffff) {
      this = (_Rb_tree<std::pair<unsigned_long_const,Molecule>*,std::pair<unsigned_long_const,Molecule>*,std::_Identity<std::pair<unsigned_long_const,Molecule>*>,std::less<std::pair<unsigned_long_const,Molecule>*>,std::allocator<std::pair<unsigned_long_const,Molecule>*>>
              *)Molecules::GetMoleculesFromInvertedIdx((Molecules *)diplo::M,pTVar1->object);
      goto LAB_0011ad1c;
    }
  }
  else {
    local_78 = Molecules::GetPair((Molecules *)diplo::M,pTVar1->subject);
    if (local_78 != (pair<const_unsigned_long,_Molecule> *)0x0) {
      this = (_Rb_tree<std::pair<unsigned_long_const,Molecule>*,std::pair<unsigned_long_const,Molecule>*,std::_Identity<std::pair<unsigned_long_const,Molecule>*>,std::less<std::pair<unsigned_long_const,Molecule>*>,std::allocator<std::pair<unsigned_long_const,Molecule>*>>
              *)local_100;
      std::
      _Rb_tree<std::pair<unsigned_long_const,Molecule>*,std::pair<unsigned_long_const,Molecule>*,std::_Identity<std::pair<unsigned_long_const,Molecule>*>,std::less<std::pair<unsigned_long_const,Molecule>*>,std::allocator<std::pair<unsigned_long_const,Molecule>*>>
      ::_M_insert_unique<std::pair<unsigned_long_const,Molecule>*const&>
                (this,&stack0xffffffffffffff88);
      goto LAB_0011ad1c;
    }
  }
  this = (_Rb_tree<std::pair<unsigned_long_const,Molecule>*,std::pair<unsigned_long_const,Molecule>*,std::_Identity<std::pair<unsigned_long_const,Molecule>*>,std::less<std::pair<unsigned_long_const,Molecule>*>,std::allocator<std::pair<unsigned_long_const,Molecule>*>>
          *)0x0;
LAB_0011ad1c:
  if (this != (_Rb_tree<std::pair<unsigned_long_const,Molecule>*,std::pair<unsigned_long_const,Molecule>*,std::_Identity<std::pair<unsigned_long_const,Molecule>*>,std::less<std::pair<unsigned_long_const,Molecule>*>,std::allocator<std::pair<unsigned_long_const,Molecule>*>>
               *)0x0) {
    p_Var8 = *(_Rb_tree_node_base **)(this + 0x18);
    molecules._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)(this + 8);
    ppVar5 = (pointer)projections;
    if (p_Var8 != (_Rb_tree_node_base *)molecules._M_t._M_impl.super__Rb_tree_header._M_node_count)
    {
      do {
        local_40 = ppVar5;
        if (((diplo::ProvTrigerON != '\x01') || (diplo::ProvMolecules._24_8_ == 0)) ||
           ((uVar9 = **(key_type **)(p_Var8 + 1),
            p_Var7 = std::
                     _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     ::_M_find_before_node
                               ((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                                 *)diplo::ProvMolecules,uVar9 % (ulong)diplo::ProvMolecules._8_8_,
                                *(key_type **)(p_Var8 + 1),uVar9), p_Var7 != (__node_base_ptr)0x0 &&
            (p_Var7->_M_nxt != (_Hash_node_base *)0x0)))) {
          diplo::moleculesCounter = diplo::moleculesCounter + 1;
          diplo::ProvFilterCH = 0;
          local_78 = (pair<const_unsigned_long,_Molecule> *)&stack0xffffffffffffffb8;
          m = (pair<const_unsigned_long,_Molecule> *)0x1;
          local_68._M_nxt = (_Hash_node_base *)0x0;
          sStack_60 = 0;
          local_58 = 1.0;
          local_50 = 0;
          p_Stack_48 = (__node_base_ptr)0x0;
          results.
          super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          auStack_b8 = (undefined1  [8])0x0;
          results.
          super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          prov.
          super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          auStack_98 = (undefined1  [8])0x0;
          prov.
          super__Vector_base<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          std::
          vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
          ::resize((vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                    *)auStack_b8,
                   ((long)(((pointer)projections)->second).
                          super__Vector_base<std::pair<unsigned_long,_Entity>,_std::allocator<std::pair<unsigned_long,_Entity>_>_>
                          ._M_impl.super__Vector_impl_data._M_start -
                    (long)(((_Vector_base<diplo::TripleIDs,_std::allocator<diplo::TripleIDs>_> *)
                           &((pointer)projections)->first)->_M_impl).super__Vector_impl_data.
                          _M_start >> 5) + 1);
          std::
          vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
          ::resize((vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                    *)auStack_98,
                   ((long)(((pointer)projections)->second).
                          super__Vector_base<std::pair<unsigned_long,_Entity>,_std::allocator<std::pair<unsigned_long,_Entity>_>_>
                          ._M_impl.super__Vector_impl_data._M_start -
                    (long)(((_Vector_base<diplo::TripleIDs,_std::allocator<diplo::TripleIDs>_> *)
                           &((pointer)projections)->first)->_M_impl).super__Vector_impl_data.
                          _M_start >> 5) +
                   ((long)(constrains->
                          super__Vector_base<diplo::TripleIDs,_std::allocator<diplo::TripleIDs>_>).
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)(constrains->
                          super__Vector_base<diplo::TripleIDs,_std::allocator<diplo::TripleIDs>_>).
                          _M_impl.super__Vector_impl_data._M_start >> 5));
          if ((constrains->super__Vector_base<diplo::TripleIDs,_std::allocator<diplo::TripleIDs>_>).
              _M_impl.super__Vector_impl_data._M_finish ==
              (constrains->super__Vector_base<diplo::TripleIDs,_std::allocator<diplo::TripleIDs>_>).
              _M_impl.super__Vector_impl_data._M_start) {
            local_34 = 0;
          }
          else {
            uVar9 = 0;
            local_34 = 0;
            _Var4._M_nxt = local_68._M_nxt;
            do {
              while (_Var4._M_nxt != (_Hash_node_base *)0x0) {
                p_Var2 = (_Var4._M_nxt)->_M_nxt;
                operator_delete(_Var4._M_nxt);
                _Var4._M_nxt = p_Var2;
              }
              memset(local_78,0,(long)m << 3);
              local_68._M_nxt = (_Hash_node_base *)0x0;
              sStack_60 = 0;
              id = (constrains->
                   super__Vector_base<diplo::TripleIDs,_std::allocator<diplo::TripleIDs>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar9].object;
              if (id == 0xffffffffffffffff) {
                TVar6 = 0xffffffff;
              }
              else {
                TVar6 = KeyManager::GetType(id);
              }
              s = KeyManager::GetType(**(KEY_ID **)(p_Var8 + 1));
              TemplateManager::GetTemplates
                        ((TemplateManager *)diplo::TM,s,
                         (constrains->
                         super__Vector_base<diplo::TripleIDs,_std::allocator<diplo::TripleIDs>_>).
                         _M_impl.super__Vector_impl_data._M_start[uVar9].predicate,TVar6,0,
                         (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                          *)&stack0xffffffffffffff88);
              Molecule::CheckIfEntityExists
                        ((Molecule *)(*(long *)(p_Var8 + 1) + 8),
                         (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                          *)&stack0xffffffffffffff88,
                         (constrains->
                         super__Vector_base<diplo::TripleIDs,_std::allocator<diplo::TripleIDs>_>).
                         _M_impl.super__Vector_impl_data._M_start[uVar9].object,0,
                         (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                          *)((long)auStack_98 + uVar9 * 0x38));
              if (((((pointer)((long)auStack_98 + uVar9 * 0x38))->_M_h)._M_element_count == 0) &&
                 (pTVar1 = (constrains->
                           super__Vector_base<diplo::TripleIDs,_std::allocator<diplo::TripleIDs>_>).
                           _M_impl.super__Vector_impl_data._M_start, pTVar1[uVar9].prov == 0)) {
                local_34 = (uint)CONCAT71((int7)((ulong)pTVar1 >> 8),1);
                bVar3 = false;
              }
              else {
                bVar3 = true;
              }
            } while ((bVar3) &&
                    (uVar9 = uVar9 + 1, _Var4._M_nxt = local_68._M_nxt,
                    uVar9 < (ulong)((long)(constrains->
                                          super__Vector_base<diplo::TripleIDs,_std::allocator<diplo::TripleIDs>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(constrains->
                                          super__Vector_base<diplo::TripleIDs,_std::allocator<diplo::TripleIDs>_>
                                          )._M_impl.super__Vector_impl_data._M_start >> 5)));
          }
          if ((local_34 & 1) == 0) {
            if ((local_40->second).
                super__Vector_base<std::pair<unsigned_long,_Entity>,_std::allocator<std::pair<unsigned_long,_Entity>_>_>
                ._M_impl.super__Vector_impl_data._M_start !=
                (pointer)(((_Vector_base<diplo::TripleIDs,_std::allocator<diplo::TripleIDs>_> *)
                          &local_40->first)->_M_impl).super__Vector_impl_data._M_start) {
              uVar9 = 0;
              _Var4._M_nxt = local_68._M_nxt;
              do {
                while (_Var4._M_nxt != (_Hash_node_base *)0x0) {
                  p_Var2 = (_Var4._M_nxt)->_M_nxt;
                  operator_delete(_Var4._M_nxt);
                  _Var4._M_nxt = p_Var2;
                }
                memset(local_78,0,(long)m << 3);
                local_68._M_nxt = (_Hash_node_base *)0x0;
                sStack_60 = 0;
                TVar6 = KeyManager::GetType(**(KEY_ID **)(p_Var8 + 1));
                TemplateManager::GetTemplates
                          ((TemplateManager *)diplo::TM,TVar6,
                           (((_Vector_base<diplo::TripleIDs,_std::allocator<diplo::TripleIDs>_> *)
                            &local_40->first)->_M_impl).super__Vector_impl_data._M_start[uVar9].
                           predicate,0xffffffff,0,
                           (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                            *)&stack0xffffffffffffff88);
                Molecule::GetEntity((Molecule *)(*(long *)(p_Var8 + 1) + 8),
                                    (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                                     *)&stack0xffffffffffffff88,0,0,
                                    (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                                     *)((long)auStack_b8 + uVar9 * 0x38),
                                    (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                                     *)((long)auStack_98 +
                                       (uVar9 + ((long)(constrains->
                                                                                                              
                                                  super__Vector_base<diplo::TripleIDs,_std::allocator<diplo::TripleIDs>_>
                                                  )._M_impl.super__Vector_impl_data._M_finish -
                                                 (long)(constrains->
                                                                                                              
                                                  super__Vector_base<diplo::TripleIDs,_std::allocator<diplo::TripleIDs>_>
                                                  )._M_impl.super__Vector_impl_data._M_start >> 5))
                                       * 0x38));
                if (((((pointer)((long)auStack_b8 + uVar9 * 0x38))->_M_h)._M_element_count == 0) &&
                   ((((_Vector_base<diplo::TripleIDs,_std::allocator<diplo::TripleIDs>_> *)
                     &local_40->first)->_M_impl).super__Vector_impl_data._M_start[uVar9].prov == 0))
                goto LAB_0011b079;
                uVar9 = uVar9 + 1;
                _Var4._M_nxt = local_68._M_nxt;
              } while (uVar9 < (ulong)((long)(local_40->second).
                                             super__Vector_base<std::pair<unsigned_long,_Entity>,_std::allocator<std::pair<unsigned_long,_Entity>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start -
                                       (long)(((_Vector_base<diplo::TripleIDs,_std::allocator<diplo::TripleIDs>_>
                                                *)&local_40->first)->_M_impl).
                                             super__Vector_impl_data._M_start >> 5));
            }
            if ((local_34 & 1) == 0) {
              std::
              vector<std::vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>
              ::push_back(resultsmaster,(value_type *)auStack_b8);
              std::
              vector<std::vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::allocator<std::vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>_>
              ::push_back(provmaster,(value_type *)auStack_98);
            }
          }
LAB_0011b079:
          if (diplo::ProvFilterCH != 0) {
            diplo::ProvFilterCounter = diplo::ProvFilterCounter + 1;
            diplo::ProvFilterCH = 0;
          }
          std::
          vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
          ::~vector((vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                     *)auStack_98);
          std::
          vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
          ::~vector((vector<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>,_std::allocator<std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                     *)auStack_b8);
          std::
          _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         *)&stack0xffffffffffffff88);
          projections = (vector<diplo::TripleIDs,_std::allocator<diplo::TripleIDs>_> *)local_40;
        }
        p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
        ppVar5 = local_40;
      } while (p_Var8 != (_Rb_tree_node_base *)
                         molecules._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
  }
  std::
  _Rb_tree<std::pair<const_unsigned_long,_Molecule>_*,_std::pair<const_unsigned_long,_Molecule>_*,_std::_Identity<std::pair<const_unsigned_long,_Molecule>_*>,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
  ::~_Rb_tree((_Rb_tree<std::pair<const_unsigned_long,_Molecule>_*,_std::pair<const_unsigned_long,_Molecule>_*,_std::_Identity<std::pair<const_unsigned_long,_Molecule>_*>,_std::less<std::pair<const_unsigned_long,_Molecule>_*>,_std::allocator<std::pair<const_unsigned_long,_Molecule>_*>_>
               *)local_100);
  return;
}

Assistant:

void API::TriplePatern(vector<TripleIDs>& constrains, vector<TripleIDs>& projections, vector<vector<unordered_set<KEY_ID>>> & resultsmaster, vector<vector<unordered_set<KEY_ID>>> & provmaster) {
    set<pair<const KEY_ID, Molecule>*> molecules;
    set<pair<const KEY_ID, Molecule>*>* Molecules_with_O = NULL;
//	cerr << "constrains[0].subject: " << constrains[0].subject << endl;
    if (constrains.size() > 0) {
        if (constrains[0].subject != 0) {
            pair<const KEY_ID, Molecule>* m = diplo::M.GetPair(constrains[0].subject);
            if (m) {
                molecules.insert(m);
                Molecules_with_O = &molecules;
//									cerr << "ok\t" << m->first << endl;
            }
        } else if (constrains[0].object != -1) {
            Molecules_with_O = diplo::M.GetMoleculesFromInvertedIdx(constrains[0].object);
        }
    } else {
        pair<const KEY_ID, Molecule>* m = diplo::M.GetPair(projections[0].subject);
        if (m) {
            molecules.insert(m);
            Molecules_with_O = &molecules;
//					cerr << "ok\t" << m->first << endl;
        }
    }

//
//	set<pair<const KEY_ID, Molecule>*>* Molecules_with_O = diplo::M.GetMoleculesFromInvertedIdx(constrains[0].object);


    if (Molecules_with_O) { // do we have any of this

        for (set<pair<const KEY_ID, Molecule>*>::iterator it = Molecules_with_O->begin(); it != Molecules_with_O->end(); it++) {

//             if (ProvTrigerON) {
//                 bool getit = false;
//                 for (auto p : ProvUris ) {
//                     auto ms = ProvIdx.find(p);
//                     if (ms == ProvIdx.end()) continue;
// 
//                     if (ms->second.find((*it)->first) != ms->second.end()) {
//                         getit = true;
//                         break;
//                     }
//                 }
//                 if (!getit) continue;
//             }
		  
            if (ProvTrigerON and !ProvMolecules.empty())
                if (ProvMolecules.find((*it)->first) == ProvMolecules.end())
                    continue;
		  
		  
		  
            //cerr << "molecules: " << diplo::KM.Get((*it)->first) << endl;
            diplo::ProvFilterCH = false;
            diplo::moleculesCounter++;
            unordered_set<size_t> tripleTemplates;
            vector<unordered_set<KEY_ID>> results;
            vector<unordered_set<KEY_ID> > prov;

            results.resize(projections.size()+1);
            prov.resize( constrains.size()+projections.size() );
            bool cont = false;
            for (size_t i = 0; i < constrains.size(); i++) {
                tripleTemplates.clear();
                TYPE_ID tt;
                if (constrains[i].object == -1) tt = -1;
                else tt = diplo::KM.GetType(constrains[i].object);

                diplo::TM.GetTemplates(diplo::KM.GetType((*it)->first), constrains[i].predicate, tt, 0, &tripleTemplates);

                (*it)->second.CheckIfEntityExists(&tripleTemplates, constrains[i].object, 0, &prov[i]); // FIXME get prov
                if (prov[i].size() <= 0 and constrains[i].prov == 0) {
//					cerr << "OK2 " << tripleTemplates.size() << endl;
                    cont = true;
                    break;
                }
            }
            if (cont)
                goto end;

            for (size_t i = 0; i < projections.size(); i++) {
                tripleTemplates.clear();
                diplo::TM.GetTemplates(diplo::KM.GetType((*it)->first), projections[i].predicate, -1, 0, &tripleTemplates);
                (*it)->second.GetEntity(&tripleTemplates, 0, 0, &results[i], &prov[i + constrains.size()]);  // FIXME get prov
//				cerr << "OK2 " << (*it)->first << "\t" << projections[i].predicate << "\t" << tripleTemplates.size() << endl;
                if (results[i].size() <= 0 and projections[i].prov == 0) {
                    cont = true;
                    break;
                }
            }
             if (cont)
                 goto end;



//			copy(results.begin(), results.end(), back_inserter(resultsmaster));
//			copy(prov.begin(), prov.end(), back_inserter(provmaster));
            resultsmaster.push_back(results);
            provmaster.push_back(prov);

            //	cout << "a-->\t" << (*it)->first << "\t" << diplo::KM.Get((*it)->first) << endl;

//			if ((*it)->first == 2097152001)
//				(*it)->second.Display();
end:
            if (diplo::ProvFilterCH) {
                diplo::ProvFilterCounter++;
                diplo::ProvFilterCH = false;
            }
        }
    }

}